

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_manager.cpp
# Opt level: O0

void __thiscall jessilib::impl::parser_manager::parser_manager(parser_manager *this)

{
  allocator<char> local_61;
  string local_60;
  shared_ptr<jessilib::json_parser> local_30;
  shared_ptr<jessilib::parser> local_20;
  parser_manager *local_10;
  parser_manager *this_local;
  
  local_10 = this;
  std::shared_mutex::shared_mutex(&this->m_mutex);
  this->m_last_id = 0;
  std::
  set<jessilib::impl::parser_manager::registration,_std::less<jessilib::impl::parser_manager::registration>,_std::allocator<jessilib::impl::parser_manager::registration>_>
  ::set(&this->m_registrations);
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<jessilib::parser>_>_>_>
  ::unordered_map(&this->m_parsers);
  std::make_shared<jessilib::json_parser>();
  std::shared_ptr<jessilib::parser>::shared_ptr<jessilib::json_parser,void>(&local_20,&local_30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"json",&local_61);
  register_parser(this,&local_20,&local_60,false);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  std::shared_ptr<jessilib::parser>::~shared_ptr(&local_20);
  std::shared_ptr<jessilib::json_parser>::~shared_ptr(&local_30);
  return;
}

Assistant:

parser_manager::parser_manager() {
	// Add library-provided default parsers; intentionally delayed until construction rather than self-registration for zero-cost static initialization when unused
	register_parser(std::make_shared<json_parser>(), "json", false);
}